

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadVarint(PmaReader *p,u64 *pnOut)

{
  long lVar1;
  byte bVar2;
  long in_FS_OFFSET;
  uint local_54;
  int rc;
  int i;
  u8 *a;
  u64 *puStack_40;
  int iBuf;
  u64 *pnOut_local;
  PmaReader *p_local;
  byte local_28 [8];
  u8 aVarint [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puStack_40 = pnOut;
  pnOut_local = (u64 *)p;
  if (p->aMap == (u8 *)0x0) {
    a._4_4_ = (int)(p->iReadOff % (long)p->nBuffer);
    if ((a._4_4_ == 0) || (p->nBuffer - a._4_4_ < 9)) {
      local_54 = 0;
      do {
        p_local._4_4_ = vdbePmaReadBlob((PmaReader *)pnOut_local,1,(u8 **)&rc);
        if (p_local._4_4_ != 0) goto LAB_0016fa76;
        local_28[(int)(local_54 & 0xf)] = *_rc;
        local_54 = local_54 + 1;
      } while ((*_rc & 0x80) != 0);
      sqlite3GetVarint(local_28,puStack_40);
    }
    else {
      bVar2 = sqlite3GetVarint(p->aBuffer + a._4_4_,pnOut);
      *pnOut_local = (ulong)bVar2 + *pnOut_local;
    }
  }
  else {
    bVar2 = sqlite3GetVarint(p->aMap + p->iReadOff,pnOut);
    *pnOut_local = (ulong)bVar2 + *pnOut_local;
  }
  p_local._4_4_ = 0;
LAB_0016fa76:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return p_local._4_4_;
}

Assistant:

static int vdbePmaReadVarint(PmaReader *p, u64 *pnOut){
  int iBuf;

  if( p->aMap ){
    p->iReadOff += sqlite3GetVarint(&p->aMap[p->iReadOff], pnOut);
  }else{
    iBuf = p->iReadOff % p->nBuffer;
    if( iBuf && (p->nBuffer-iBuf)>=9 ){
      p->iReadOff += sqlite3GetVarint(&p->aBuffer[iBuf], pnOut);
    }else{
      u8 aVarint[16], *a;
      int i = 0, rc;
      do{
        rc = vdbePmaReadBlob(p, 1, &a);
        if( rc ) return rc;
        aVarint[(i++)&0xf] = a[0];
      }while( (a[0]&0x80)!=0 );
      sqlite3GetVarint(aVarint, pnOut);
    }
  }

  return SQLITE_OK;
}